

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseGTMCoverage::ParseMCOVLine
          (cmParseGTMCoverage *this,string *line,string *routine,string *function,int *linenumber,
          int *count)

{
  cmCTest *this_00;
  int iVar1;
  long lVar2;
  char *pcVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pvVar6;
  char cVar7;
  byte local_289;
  string local_280 [32];
  undefined1 local_260 [8];
  ostringstream cmCTestLog_msg;
  string local_e8 [32];
  undefined8 local_c8;
  size_type pos2;
  char local_8a;
  byte local_89;
  undefined1 local_88 [6];
  char cur;
  bool done;
  string arg;
  size_type pos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int *count_local;
  int *linenumber_local;
  string *function_local;
  string *routine_local;
  string *line_local;
  cmParseGTMCoverage *this_local;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)count;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pos);
  cVar7 = (char)line;
  lVar2 = std::__cxx11::string::find(cVar7,0x28);
  if (lVar2 == -1) {
    this_local._7_1_ = false;
    arg.field_2._12_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)local_88);
    local_89 = 0;
    while( true ) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)line);
      local_289 = 0;
      if (*pcVar3 != '\0') {
        local_289 = local_89 ^ 0xff;
      }
      if ((local_289 & 1) == 0) break;
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)line);
      local_8a = *pcVar3;
      if ((local_8a == ',') || (local_8a == ')')) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&pos,(value_type *)local_88);
        std::__cxx11::string::operator=((string *)local_88,"");
        if (local_8a == ')') {
          local_89 = 1;
        }
      }
      else if (((local_8a != '\"') && (local_8a != '(')) && (local_8a != '%')) {
        std::__cxx11::string::operator[]((ulong)line);
        std::__cxx11::string::append((ulong)local_88,'\x01');
      }
    }
    lVar2 = std::__cxx11::string::find(cVar7,0x3d);
    if (lVar2 == -1) {
      this_local._7_1_ = false;
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)line);
      if (*pcVar3 == '\"') {
        local_c8 = std::__cxx11::string::find(cVar7,0x3a);
        std::__cxx11::string::substr((ulong)local_e8,(ulong)line);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar1 = atoi(pcVar3);
        *(int *)args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar1;
        std::__cxx11::string::~string(local_e8);
      }
      else {
        std::__cxx11::string::substr((ulong)&pos2,(ulong)line);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iVar1 = atoi(pcVar3);
        *(int *)args.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar1;
        std::__cxx11::string::~string((string *)&pos2);
      }
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&pos);
      if (sVar4 < 2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
        poVar5 = std::operator<<((ostream *)local_260,"Error parsing mcov line: [");
        poVar5 = std::operator<<(poVar5,(string *)line);
        std::operator<<(poVar5,"]\n");
        this_00 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParseGTMCoverage.cxx"
                     ,0x10b,pcVar3,false);
        std::__cxx11::string::~string(local_280);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
        this_local._7_1_ = false;
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&pos,0);
        std::__cxx11::string::operator=((string *)routine,(string *)pvVar6);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&pos,1);
        std::__cxx11::string::operator=((string *)function,(string *)pvVar6);
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pos);
        if (sVar4 == 2) {
          std::__cxx11::string::operator=((string *)routine,"");
          std::__cxx11::string::operator=((string *)function,"");
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&pos,2);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          iVar1 = atoi(pcVar3);
          *linenumber = iVar1;
        }
        this_local._7_1_ = true;
      }
    }
    arg.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_88);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&pos);
  return this_local._7_1_;
}

Assistant:

bool cmParseGTMCoverage::ParseMCOVLine(std::string const& line,
                                       std::string& routine,
                                       std::string& function,
                                       int& linenumber,
                                       int& count)
{
  // this method parses lines from the .mcov file
  // each line has ^COVERAGE(...) in it, and there
  // are several varients of coverage lines:
  //
  // ^COVERAGE("DIC11","PR1",0)="2:0:0:0"
  //          ( file  , entry, line ) = "number_executed:timing_info"
  // ^COVERAGE("%RSEL","SRC")="1:0:0:0"
  //          ( file  , entry ) = "number_executed:timing_info"
  // ^COVERAGE("%RSEL","init",8,"FOR_LOOP",1)=1
  //          ( file  , entry, line, IGNORE ) =number_executed
  std::vector<std::string> args;
  std::string::size_type pos = line.find('(', 0);
  // if no ( is found, then return line has no coverage
  if(pos == std::string::npos)
    {
    return false;
    }
  std::string arg;
  bool done = false;
  // separate out all of the comma separated arguments found
  // in the COVERAGE(...) line
  while(line[pos] && !done)
    {
    // save the char we are looking at
    char cur = line[pos];
    // , or ) means end of argument
    if(cur == ',' || cur == ')')
      {
      // save the argument into the argument vector
      args.push_back(arg);
      // start on a new argument
      arg = "";
      // if we are at the end of the ), then finish while loop
      if(cur == ')')
        {
        done = true;
        }
      }
    else
      {
      // all chars except ", (, and % get stored in the arg string
      if(cur != '\"' && cur != '(' && cur != '%')
        {
        arg.append(1, line[pos]);
        }
      }
    // move to next char
    pos++;
    }
  // now parse the right hand side of the =
  pos = line.find('=');
  // no = found, this is an error
  if(pos == line.npos)
    {
    return false;
    }
  pos++; // move past =

  // if the next positing is not a ", then this is a
  // COVERAGE(..)=count line and turn the rest of the string
  // past the = into an integer and set it to count
  if(line[pos] != '\"')
    {
    count = atoi(line.substr(pos).c_str());
    }
  else
    {
    // this means line[pos] is a ", and we have a
    // COVERAGE(...)="1:0:0:0" type of line
    pos++; // move past "
    // find the first : past the "
    std::string::size_type pos2 = line.find(':', pos);
    // turn the string between the " and the first : into an integer
    // and set it to count
    count = atoi(line.substr(pos, pos2-pos).c_str());
    }
  // less then two arguments is an error
  if(args.size() < 2)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error parsing mcov line: [" << line << "]\n");
    return false;
    }
  routine = args[0]; // the routine is the first argument
  function = args[1]; // the function in the routine is the second
  // in the two argument only format
  // ^COVERAGE("%RSEL","SRC"), the line offset is 0
  if(args.size() == 2)
    {
    // To avoid double counting of line 0 of each entry point,
    // Don't count the lines that do not give an explicit line
    // number.
    routine="";
    function="";
    }
  else
    {
    // this is the format for this line
    // ^COVERAGE("%RSEL","SRC",count)
    linenumber = atoi(args[2].c_str());
    }
  return true;
}